

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# lz4.c
# Opt level: O2

int LZ4_decompress_safe_usingDict
              (char *source,char *dest,int compressedSize,int maxOutputSize,char *dictStart,
              int dictSize)

{
  byte *pbVar1;
  byte bVar2;
  char cVar3;
  uint uVar4;
  undefined8 uVar5;
  ushort uVar6;
  ushort uVar7;
  int iVar8;
  ushort *puVar9;
  ushort *puVar10;
  char *pcVar11;
  char *pcVar12;
  char *pcVar13;
  char *pcVar14;
  long lVar15;
  size_t sVar16;
  long lVar17;
  char *pcVar18;
  char *pcVar19;
  ulong uVar20;
  char *pcVar21;
  char *pcVar22;
  ushort *puVar23;
  size_t prefixSize;
  long lVar24;
  ulong uVar25;
  char *pcVar26;
  int iStack_38;
  
  iStack_38 = (int)source;
  if (dictSize != 0) {
    prefixSize = (size_t)dictSize;
    if (dictStart + prefixSize != dest) {
      iVar8 = -1;
      if (-1 < maxOutputSize && source != (char *)0x0) {
        pcVar12 = dictStart + prefixSize;
        if (dictStart == (char *)0x0) {
          pcVar12 = (char *)0x0;
        }
        if (maxOutputSize == 0) {
          if (compressedSize == 1) {
            iVar8 = -(uint)(*source != '\0');
          }
        }
        else if (compressedSize != 0) {
          pbVar1 = (byte *)(source + compressedSize);
          pcVar19 = dest + (uint)maxOutputSize;
          pcVar14 = pcVar19 + -7;
          puVar23 = (ushort *)source;
          pcVar11 = dest;
          do {
            while( true ) {
              puVar10 = (ushort *)((long)puVar23 + 1);
              bVar2 = (byte)*puVar23;
              sVar16 = (size_t)(uint)(bVar2 >> 4);
              if (bVar2 >> 4 == 0xf) break;
              if ((source + (long)compressedSize + -0x10 <= puVar10) ||
                 (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar11)) goto LAB_0029ab36;
              uVar5 = *(undefined8 *)((long)puVar23 + 9);
              *(undefined8 *)pcVar11 = *(undefined8 *)puVar10;
              *(undefined8 *)(pcVar11 + 8) = uVar5;
              pcVar21 = pcVar11 + sVar16;
              uVar20 = (ulong)(bVar2 & 0xf);
              puVar23 = (ushort *)((long)puVar10 + sVar16);
              puVar10 = puVar23 + 1;
              uVar6 = *puVar23;
              pcVar22 = pcVar21 + -(ulong)uVar6;
              if (((uVar20 == 0xf) || (uVar6 < 8)) || (pcVar22 < dest)) goto LAB_0029abef;
              *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
              *(undefined8 *)(pcVar21 + 8) = *(undefined8 *)(pcVar22 + 8);
              *(undefined2 *)(pcVar21 + 0x10) = *(undefined2 *)(pcVar22 + 0x10);
              puVar23 = puVar10;
              pcVar11 = pcVar21 + uVar20 + 4;
            }
            if (pbVar1 + -0xf <= puVar10) goto LAB_0029ae30;
            puVar23 = puVar23 + 1;
            lVar24 = 0;
            puVar9 = puVar10;
            do {
              puVar10 = (ushort *)((long)puVar9 + 1);
              if (pbVar1 + -0xf < puVar10) goto LAB_0029ae30;
              uVar6 = *puVar9;
              lVar24 = lVar24 + (ulong)(byte)uVar6;
              puVar23 = (ushort *)((long)puVar23 + 1);
              puVar9 = puVar10;
            } while ((ulong)(byte)uVar6 == 0xff);
            if (((lVar24 == -1) || (sVar16 = lVar24 + 0xf, CARRY8((ulong)pcVar11,sVar16))) ||
               ((ulong)-(long)puVar23 < sVar16)) goto LAB_0029ae30;
LAB_0029ab36:
            pcVar21 = pcVar11 + sVar16;
            if ((pcVar19 + -0xc < pcVar21) ||
               (puVar23 = (ushort *)((long)puVar10 + sVar16), pbVar1 + -8 < puVar23)) {
              if (((byte *)((long)puVar10 + sVar16) == pbVar1) && (pcVar21 <= pcVar19)) {
                memmove(pcVar11,puVar10,sVar16);
                return (int)pcVar21 - (int)dest;
              }
LAB_0029ae30:
              return ~(uint)puVar10 + iStack_38;
            }
            do {
              *(undefined8 *)pcVar11 = *(undefined8 *)puVar10;
              pcVar11 = pcVar11 + 8;
              puVar10 = puVar10 + 4;
            } while (pcVar11 < pcVar21);
            uVar6 = *puVar23;
            puVar10 = puVar23 + 1;
            pcVar22 = pcVar21 + -(ulong)uVar6;
            uVar20 = (ulong)(bVar2 & 0xf);
LAB_0029abef:
            if ((int)uVar20 == 0xf) {
              lVar24 = 0;
              puVar23 = puVar10;
              do {
                puVar10 = (ushort *)((long)puVar23 + 1);
                if (pbVar1 + -4 < puVar10) goto LAB_0029ae30;
                uVar7 = *puVar23;
                lVar24 = lVar24 + (ulong)(byte)uVar7;
                puVar23 = puVar10;
              } while ((ulong)(byte)uVar7 == 0xff);
              uVar20 = lVar24 + 0xf;
              if ((lVar24 == -1) || (CARRY8((ulong)pcVar21,uVar20))) goto LAB_0029ae30;
            }
            if ((prefixSize < 0x10000) && (pcVar22 + prefixSize < dest)) goto LAB_0029ae30;
            sVar16 = uVar20 + 4;
            pcVar26 = pcVar21 + sVar16;
            puVar23 = puVar10;
            pcVar11 = pcVar26;
            if (pcVar22 < dest) {
              if (pcVar19 + -5 < pcVar26) goto LAB_0029ae30;
              uVar25 = (long)dest - (long)pcVar22;
              uVar20 = sVar16 - uVar25;
              if (sVar16 < uVar25 || uVar20 == 0) {
                memmove(pcVar21,pcVar12 + -uVar25,sVar16);
              }
              else {
                memcpy(pcVar21,pcVar12 + -uVar25,uVar25);
                pcVar11 = pcVar21 + uVar25;
                pcVar21 = dest;
                if ((ulong)((long)pcVar11 - (long)dest) < uVar20) {
                  for (; pcVar11 < pcVar26; pcVar11 = pcVar11 + 1) {
                    *pcVar11 = *pcVar21;
                    pcVar21 = pcVar21 + 1;
                  }
                }
                else {
                  memcpy(pcVar11,dest,uVar20);
                  pcVar11 = pcVar26;
                }
              }
            }
            else {
              if (uVar6 < 8) {
                pcVar21[0] = '\0';
                pcVar21[1] = '\0';
                pcVar21[2] = '\0';
                pcVar21[3] = '\0';
                *pcVar21 = *pcVar22;
                pcVar21[1] = pcVar22[1];
                pcVar21[2] = pcVar22[2];
                pcVar21[3] = pcVar22[3];
                uVar4 = inc32table[uVar6];
                *(undefined4 *)(pcVar21 + 4) = *(undefined4 *)(pcVar22 + uVar4);
                pcVar22 = pcVar22 + ((ulong)uVar4 - (long)dec64table[uVar6]);
              }
              else {
                *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
                pcVar22 = pcVar22 + 8;
              }
              pcVar13 = pcVar21 + 8;
              if (pcVar19 + -0xc < pcVar26) {
                if (pcVar19 + -5 < pcVar26) goto LAB_0029ae30;
                pcVar21 = pcVar22;
                pcVar18 = pcVar13;
                if (pcVar13 < pcVar14) {
                  do {
                    *(undefined8 *)pcVar18 = *(undefined8 *)pcVar21;
                    pcVar18 = pcVar18 + 8;
                    pcVar21 = pcVar21 + 8;
                  } while (pcVar18 < pcVar14);
                  pcVar22 = pcVar22 + ((long)pcVar14 - (long)pcVar13);
                  pcVar13 = pcVar14;
                }
                for (; pcVar13 < pcVar26; pcVar13 = pcVar13 + 1) {
                  cVar3 = *pcVar22;
                  pcVar22 = pcVar22 + 1;
                  *pcVar13 = cVar3;
                }
              }
              else {
                *(undefined8 *)pcVar13 = *(undefined8 *)pcVar22;
                if (0x10 < sVar16) {
                  pcVar21 = pcVar21 + 0x10;
                  do {
                    pcVar22 = pcVar22 + 8;
                    *(undefined8 *)pcVar21 = *(undefined8 *)pcVar22;
                    pcVar21 = pcVar21 + 8;
                  } while (pcVar21 < pcVar26);
                }
              }
            }
          } while( true );
        }
      }
      return iVar8;
    }
    if (dictSize < 0xffff) {
      iVar8 = LZ4_decompress_safe_withSmallPrefix
                        (source,dest,compressedSize,maxOutputSize,prefixSize);
      return iVar8;
    }
    iVar8 = -1;
    if (-1 < maxOutputSize && source != (char *)0x0) {
      if (maxOutputSize == 0) {
        if (compressedSize == 1) {
          iVar8 = -(uint)(*source != '\0');
        }
      }
      else if (compressedSize != 0) {
        pbVar1 = (byte *)(source + compressedSize);
        uVar20 = (ulong)(uint)maxOutputSize;
        pcVar12 = dest + (uVar20 - 7);
        lVar24 = 0;
        puVar23 = (ushort *)source;
        do {
          while( true ) {
            pcVar14 = dest + lVar24;
            puVar10 = (ushort *)((long)puVar23 + 1);
            bVar2 = (byte)*puVar23;
            sVar16 = (size_t)(uint)(bVar2 >> 4);
            if (bVar2 >> 4 == 0xf) break;
            if ((source + (long)compressedSize + -0x10 <= puVar10) ||
               (dest + (uVar20 - 0x20) < pcVar14)) goto LAB_0029a695;
            uVar5 = *(undefined8 *)((long)puVar23 + 9);
            *(undefined8 *)pcVar14 = *(undefined8 *)puVar10;
            *(undefined8 *)(pcVar14 + 8) = uVar5;
            lVar24 = lVar24 + sVar16;
            uVar25 = (ulong)(bVar2 & 0xf);
            puVar23 = (ushort *)((long)puVar10 + sVar16);
            puVar10 = puVar23 + 1;
            uVar6 = *puVar23;
            lVar15 = lVar24 - (ulong)uVar6;
            if (uVar6 < 8 || uVar25 == 0xf) goto LAB_0029a751;
            *(undefined8 *)(dest + lVar24) = *(undefined8 *)(dest + lVar15);
            *(undefined8 *)(dest + lVar24 + 8) = *(undefined8 *)(dest + lVar15 + 8);
            *(undefined2 *)(dest + lVar24 + 0x10) = *(undefined2 *)(dest + lVar15 + 0x10);
            lVar24 = lVar24 + uVar25 + 4;
            puVar23 = puVar10;
          }
          if (pbVar1 + -0xf <= puVar10) goto LAB_0029a8cd;
          puVar23 = puVar23 + 1;
          lVar15 = 0;
          puVar9 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar9 + 1);
            if (pbVar1 + -0xf < puVar10) goto LAB_0029a8cd;
            uVar6 = *puVar9;
            lVar15 = lVar15 + (ulong)(byte)uVar6;
            puVar23 = (ushort *)((long)puVar23 + 1);
            puVar9 = puVar10;
          } while ((ulong)(byte)uVar6 == 0xff);
          if (((lVar15 == -1) || (sVar16 = lVar15 + 0xf, CARRY8((ulong)pcVar14,sVar16))) ||
             ((ulong)-(long)puVar23 < sVar16)) goto LAB_0029a8cd;
LAB_0029a695:
          lVar24 = lVar24 + sVar16;
          if ((dest + (uVar20 - 0xc) < dest + lVar24) ||
             (puVar23 = (ushort *)((long)puVar10 + sVar16), pbVar1 + -8 < puVar23)) {
            if (((byte *)((long)puVar10 + sVar16) == pbVar1) && (lVar24 <= (long)uVar20)) {
              memmove(pcVar14,puVar10,sVar16);
              return (int)lVar24;
            }
LAB_0029a8cd:
            return ~(uint)puVar10 + iStack_38;
          }
          do {
            *(undefined8 *)pcVar14 = *(undefined8 *)puVar10;
            pcVar14 = pcVar14 + 8;
            puVar10 = puVar10 + 4;
          } while (pcVar14 < dest + lVar24);
          uVar6 = *puVar23;
          puVar10 = puVar23 + 1;
          lVar15 = lVar24 - (ulong)uVar6;
          uVar25 = (ulong)(bVar2 & 0xf);
LAB_0029a751:
          pcVar14 = dest + lVar24;
          if ((int)uVar25 == 0xf) {
            lVar17 = 0;
            puVar23 = puVar10;
            do {
              puVar10 = (ushort *)((long)puVar23 + 1);
              if (pbVar1 + -4 < puVar10) goto LAB_0029a8cd;
              uVar7 = *puVar23;
              lVar17 = lVar17 + (ulong)(byte)uVar7;
              puVar23 = puVar10;
            } while ((ulong)(byte)uVar7 == 0xff);
            uVar25 = lVar17 + 0xf;
            if ((lVar17 == -1) || (CARRY8((ulong)pcVar14,uVar25))) goto LAB_0029a8cd;
          }
          if (lVar15 < -0x10000) goto LAB_0029a8cd;
          pcVar19 = dest + lVar15;
          if (uVar6 < 8) {
            pcVar14[0] = '\0';
            pcVar14[1] = '\0';
            pcVar14[2] = '\0';
            pcVar14[3] = '\0';
            *pcVar14 = *pcVar19;
            pcVar14[1] = pcVar19[1];
            pcVar14[2] = pcVar19[2];
            pcVar14[3] = pcVar19[3];
            uVar4 = inc32table[uVar6];
            *(undefined4 *)(pcVar14 + 4) = *(undefined4 *)(pcVar19 + uVar4);
            pcVar19 = pcVar19 + ((ulong)uVar4 - (long)dec64table[uVar6]);
          }
          else {
            *(undefined8 *)pcVar14 = *(undefined8 *)pcVar19;
            pcVar19 = pcVar19 + 8;
          }
          lVar24 = lVar24 + uVar25 + 4;
          pcVar21 = dest + lVar24;
          pcVar11 = pcVar14 + 8;
          puVar23 = puVar10;
          if (dest + (uVar20 - 0xc) < pcVar21) {
            if (dest + (uVar20 - 5) < pcVar21) goto LAB_0029a8cd;
            pcVar14 = pcVar19;
            pcVar22 = pcVar11;
            if (pcVar11 < pcVar12) {
              do {
                *(undefined8 *)pcVar22 = *(undefined8 *)pcVar14;
                pcVar22 = pcVar22 + 8;
                pcVar14 = pcVar14 + 8;
              } while (pcVar22 < pcVar12);
              pcVar19 = pcVar19 + ((long)pcVar12 - (long)pcVar11);
              pcVar11 = pcVar12;
            }
            for (; pcVar11 < pcVar21; pcVar11 = pcVar11 + 1) {
              cVar3 = *pcVar19;
              pcVar19 = pcVar19 + 1;
              *pcVar11 = cVar3;
            }
          }
          else {
            *(undefined8 *)pcVar11 = *(undefined8 *)pcVar19;
            if (0x10 < uVar25 + 4) {
              pcVar14 = pcVar14 + 0x10;
              do {
                pcVar19 = pcVar19 + 8;
                *(undefined8 *)pcVar14 = *(undefined8 *)pcVar19;
                pcVar14 = pcVar14 + 8;
              } while (pcVar14 < pcVar21);
            }
          }
        } while( true );
      }
    }
    return iVar8;
  }
  iVar8 = -1;
  if (-1 < maxOutputSize && source != (char *)0x0) {
    if (maxOutputSize == 0) {
      if (compressedSize == 1) {
        iVar8 = -(uint)(*source != '\0');
      }
    }
    else if (compressedSize != 0) {
      pbVar1 = (byte *)(source + compressedSize);
      pcVar14 = dest + (uint)maxOutputSize;
      pcVar12 = pcVar14 + -7;
      puVar23 = (ushort *)source;
      pcVar19 = dest;
      do {
        while( true ) {
          puVar10 = (ushort *)((long)puVar23 + 1);
          bVar2 = (byte)*puVar23;
          sVar16 = (size_t)(uint)(bVar2 >> 4);
          if (bVar2 >> 4 == 0xf) break;
          if ((source + (long)compressedSize + -0x10 <= puVar10) ||
             (dest + ((ulong)(uint)maxOutputSize - 0x20) < pcVar19)) goto LAB_00299e94;
          uVar5 = *(undefined8 *)((long)puVar23 + 9);
          *(undefined8 *)pcVar19 = *(undefined8 *)puVar10;
          *(undefined8 *)(pcVar19 + 8) = uVar5;
          pcVar11 = pcVar19 + sVar16;
          uVar20 = (ulong)(bVar2 & 0xf);
          puVar23 = (ushort *)((long)puVar10 + sVar16);
          puVar10 = puVar23 + 1;
          uVar6 = *puVar23;
          pcVar21 = pcVar11 + -(ulong)uVar6;
          if (((uVar20 == 0xf) || (uVar6 < 8)) || (pcVar21 < dest)) goto LAB_00299f43;
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar21;
          *(undefined8 *)(pcVar11 + 8) = *(undefined8 *)(pcVar21 + 8);
          *(undefined2 *)(pcVar11 + 0x10) = *(undefined2 *)(pcVar21 + 0x10);
          pcVar19 = pcVar11 + uVar20 + 4;
          puVar23 = puVar10;
        }
        if (pbVar1 + -0xf <= puVar10) goto LAB_0029a0b8;
        puVar23 = puVar23 + 1;
        lVar24 = 0;
        puVar9 = puVar10;
        do {
          puVar10 = (ushort *)((long)puVar9 + 1);
          if (pbVar1 + -0xf < puVar10) goto LAB_0029a0b8;
          uVar6 = *puVar9;
          lVar24 = lVar24 + (ulong)(byte)uVar6;
          puVar23 = (ushort *)((long)puVar23 + 1);
          puVar9 = puVar10;
        } while ((ulong)(byte)uVar6 == 0xff);
        if (((lVar24 == -1) || (sVar16 = lVar24 + 0xf, CARRY8((ulong)pcVar19,sVar16))) ||
           ((ulong)-(long)puVar23 < sVar16)) goto LAB_0029a0b8;
LAB_00299e94:
        pcVar11 = pcVar19 + sVar16;
        if ((pcVar14 + -0xc < pcVar11) ||
           (puVar23 = (ushort *)((long)puVar10 + sVar16), pbVar1 + -8 < puVar23)) {
          if (((byte *)((long)puVar10 + sVar16) == pbVar1) && (pcVar11 <= pcVar14)) {
            memmove(pcVar19,puVar10,sVar16);
            return (int)pcVar11 - (int)dest;
          }
LAB_0029a0b8:
          return ~(uint)puVar10 + iStack_38;
        }
        do {
          *(undefined8 *)pcVar19 = *(undefined8 *)puVar10;
          pcVar19 = pcVar19 + 8;
          puVar10 = puVar10 + 4;
        } while (pcVar19 < pcVar11);
        uVar6 = *puVar23;
        puVar10 = puVar23 + 1;
        pcVar21 = pcVar11 + -(ulong)uVar6;
        uVar20 = (ulong)(bVar2 & 0xf);
LAB_00299f43:
        if ((int)uVar20 == 0xf) {
          lVar24 = 0;
          puVar23 = puVar10;
          do {
            puVar10 = (ushort *)((long)puVar23 + 1);
            if (pbVar1 + -4 < puVar10) goto LAB_0029a0b8;
            uVar7 = *puVar23;
            lVar24 = lVar24 + (ulong)(byte)uVar7;
            puVar23 = puVar10;
          } while ((ulong)(byte)uVar7 == 0xff);
          uVar20 = lVar24 + 0xf;
          if ((lVar24 == -1) || (CARRY8((ulong)pcVar11,uVar20))) goto LAB_0029a0b8;
        }
        if (pcVar21 < dest) goto LAB_0029a0b8;
        if (uVar6 < 8) {
          pcVar11[0] = '\0';
          pcVar11[1] = '\0';
          pcVar11[2] = '\0';
          pcVar11[3] = '\0';
          *pcVar11 = *pcVar21;
          pcVar11[1] = pcVar21[1];
          pcVar11[2] = pcVar21[2];
          pcVar11[3] = pcVar21[3];
          uVar4 = inc32table[uVar6];
          *(undefined4 *)(pcVar11 + 4) = *(undefined4 *)(pcVar21 + uVar4);
          pcVar21 = pcVar21 + ((ulong)uVar4 - (long)dec64table[uVar6]);
        }
        else {
          *(undefined8 *)pcVar11 = *(undefined8 *)pcVar21;
          pcVar21 = pcVar21 + 8;
        }
        pcVar19 = pcVar11 + uVar20 + 4;
        pcVar22 = pcVar11 + 8;
        puVar23 = puVar10;
        if (pcVar14 + -0xc < pcVar19) {
          if (pcVar14 + -5 < pcVar19) goto LAB_0029a0b8;
          pcVar11 = pcVar21;
          pcVar26 = pcVar22;
          if (pcVar22 < pcVar12) {
            do {
              *(undefined8 *)pcVar26 = *(undefined8 *)pcVar11;
              pcVar26 = pcVar26 + 8;
              pcVar11 = pcVar11 + 8;
            } while (pcVar26 < pcVar12);
            pcVar21 = pcVar21 + ((long)pcVar12 - (long)pcVar22);
            pcVar22 = pcVar12;
          }
          for (; pcVar22 < pcVar19; pcVar22 = pcVar22 + 1) {
            cVar3 = *pcVar21;
            pcVar21 = pcVar21 + 1;
            *pcVar22 = cVar3;
          }
        }
        else {
          *(undefined8 *)pcVar22 = *(undefined8 *)pcVar21;
          if (0x10 < uVar20 + 4) {
            pcVar11 = pcVar11 + 0x10;
            do {
              pcVar21 = pcVar21 + 8;
              *(undefined8 *)pcVar11 = *(undefined8 *)pcVar21;
              pcVar11 = pcVar11 + 8;
            } while (pcVar11 < pcVar19);
          }
        }
      } while( true );
    }
  }
  return iVar8;
}

Assistant:

int LZ4_decompress_safe_usingDict(const char* source, char* dest, int compressedSize, int maxOutputSize, const char* dictStart, int dictSize)
{
    if (dictSize==0)
        return LZ4_decompress_safe(source, dest, compressedSize, maxOutputSize);
    if (dictStart+dictSize == dest) {
        if (dictSize >= 64 KB - 1) {
            return LZ4_decompress_safe_withPrefix64k(source, dest, compressedSize, maxOutputSize);
        }
        assert(dictSize >= 0);
        return LZ4_decompress_safe_withSmallPrefix(source, dest, compressedSize, maxOutputSize, (size_t)dictSize);
    }
    assert(dictSize >= 0);
    return LZ4_decompress_safe_forceExtDict(source, dest, compressedSize, maxOutputSize, dictStart, (size_t)dictSize);
}